

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

AlexNode<int,_int> * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::NodeIterator::
next(NodeIterator *this)

{
  stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
  *this_00;
  iterator *piVar1;
  AlexNode<int,_int> **__args;
  int iVar2;
  double dVar3;
  AlexNode<int,_int> *pAVar4;
  bool bVar5;
  _Elt_pointer ppAVar6;
  AlexNode<int,_int> *pAVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  ppAVar6 = (this->node_stack_).c.
            super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar6 ==
      (this->node_stack_).c.
      super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    this->cur_node_ = (AlexNode<int,_int> *)0x0;
    pAVar7 = (AlexNode<int,_int> *)0x0;
  }
  else {
    this_00 = &this->node_stack_;
    if (ppAVar6 ==
        (this->node_stack_).c.
        super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppAVar6 = (this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->cur_node_ = ppAVar6[-1];
    std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::pop_back
              (&this_00->c);
    pAVar7 = this->cur_node_;
    if (pAVar7->is_leaf_ == false) {
      iVar2._0_1_ = pAVar7[1].is_leaf_;
      iVar2._1_1_ = pAVar7[1].duplication_factor_;
      iVar2._2_2_ = pAVar7[1].level_;
      __args = (AlexNode<int,_int> **)((long)pAVar7[1].model_.a_ + -8 + (long)iVar2 * 8);
      ppAVar6 = (this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppAVar6 ==
          (this->node_stack_).c.
          super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
        _M_push_back_aux<alex::AlexNode<int,int>*const&>
                  ((deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
                   this_00,__args);
      }
      else {
        *ppAVar6 = *__args;
        piVar1 = &(this->node_stack_).c.
                  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      if (1 < *(int *)&pAVar7[1].is_leaf_) {
        uVar8 = (ulong)(*(int *)&pAVar7[1].is_leaf_ - 2);
        lVar9 = uVar8 << 3;
        lVar10 = uVar8 + 1;
        do {
          dVar3 = pAVar7[1].model_.a_;
          pAVar4 = *(AlexNode<int,_int> **)((long)dVar3 + -8 + lVar10 * 8);
          if (pAVar4 != *(AlexNode<int,_int> **)((long)dVar3 + lVar10 * 8)) {
            ppAVar6 = (this->node_stack_).c.
                      super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (ppAVar6 ==
                (this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
              _M_push_back_aux<alex::AlexNode<int,int>*const&>
                        ((deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *
                         )this_00,(AlexNode<int,_int> **)((long)dVar3 + lVar9));
            }
            else {
              *ppAVar6 = pAVar4;
              piVar1 = &(this->node_stack_).c.
                        super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
          }
          lVar9 = lVar9 + -8;
          lVar11 = lVar10 + -1;
          bVar5 = 0 < lVar10;
          lVar10 = lVar11;
        } while (lVar11 != 0 && bVar5);
      }
    }
    pAVar7 = this->cur_node_;
  }
  return pAVar7;
}

Assistant:

AlexNode<T, P>* next() {
      if (node_stack_.empty()) {
        cur_node_ = nullptr;
        return nullptr;
      }

      cur_node_ = node_stack_.top();
      node_stack_.pop();

      if (!cur_node_->is_leaf_) {
        auto node = static_cast<model_node_type*>(cur_node_);
        node_stack_.push(node->children_[node->num_children_ - 1]);
        for (int i = node->num_children_ - 2; i >= 0; i--) {
          if (node->children_[i] != node->children_[i + 1]) {
            node_stack_.push(node->children_[i]);
          }
        }
      }

      return cur_node_;
    }